

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void expr_table(LexState *ls,ExpDesc *e)

{
  MSize MVar1;
  FuncState *fs;
  bool bVar2;
  TValue TVar3;
  bool bVar4;
  bool bVar5;
  BCPos BVar6;
  int iVar7;
  BCReg BVar8;
  uint uVar9;
  ExpKind EVar10;
  GCstr *pGVar11;
  GCobj *gc;
  TValue *pTVar12;
  ulong uVar13;
  ushort uVar14;
  uint32_t uVar15;
  uint32_t hbits;
  long lVar16;
  uint uVar17;
  GCobj *o;
  uint uVar18;
  TValue k;
  ExpDesc val;
  cTValue local_88;
  uint uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  BCLine local_70;
  BCReg local_6c;
  TValue *local_68;
  cTValue local_60;
  anon_union_8_3_2ce71dea_for_u local_58;
  uint local_50;
  int local_4c;
  int local_48;
  ulong local_40;
  ulong local_38;
  
  fs = ls->fs;
  local_70 = ls->linenumber;
  BVar8 = fs->freereg;
  local_38 = (ulong)(BVar8 * 0x100);
  BVar6 = bcemit_INS(fs,BVar8 * 0x100 + 0x32);
  e->k = VNONRELOC;
  (e->u).s.info = BVar8;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  uVar18 = 1;
  bcreg_reserve(fs,1);
  lex_check(ls,0x7b);
  iVar7 = ls->token;
  if (iVar7 == 0x7d) {
    lex_match(ls,0x7d,0x7b,local_70);
    uVar18 = 1;
    gc = (GCobj *)0x0;
    bVar4 = false;
    bVar5 = false;
    uVar17 = 0;
  }
  else {
    local_6c = BVar8 + 1;
    local_68 = &ls->lookaheadval;
    local_40 = (ulong)BVar6;
    gc = (GCobj *)0x0;
    bVar4 = false;
    bVar5 = false;
    uVar17 = 0;
    do {
      if (iVar7 == 0x11f) {
        iVar7 = llex(ls,local_68);
        ls->lookahead = iVar7;
        if (iVar7 == 0x3d) {
          uStack_80 = 3;
          uStack_7c = 0xffffffff;
          local_88.u32.lo = 0;
          uStack_78 = 0xffffffff;
          pGVar11 = lex_str(ls);
          local_88.u32.lo = (uint32_t)pGVar11;
          local_88.field_2.it = (uint32_t)((ulong)pGVar11 >> 0x20);
          lex_check(ls,0x3d);
          uVar17 = uVar17 + 1;
          goto LAB_0011b269;
        }
LAB_0011b26d:
        uStack_80 = 4;
        uStack_7c = 0xffffffff;
        uStack_78 = 0xffffffff;
        local_88.n = (lua_Number)(int)uVar18;
        uVar18 = uVar18 + 1;
        bVar4 = true;
        bVar2 = true;
      }
      else {
        if (iVar7 != 0x5b) goto LAB_0011b26d;
        expr_bracket(ls,(ExpDesc *)&local_88.field_2);
        if (4 < uStack_80) {
          expr_index(fs,e,(ExpDesc *)&local_88.field_2);
        }
        if ((uStack_80 == 4) && (ABS((double)local_88.u64) == 0.0)) {
          bVar4 = true;
        }
        else {
          uVar17 = uVar17 + 1;
        }
        lex_check(ls,0x3d);
LAB_0011b269:
        bVar2 = false;
      }
      expr_binop(ls,(ExpDesc *)&local_58.s,0);
      if ((uStack_80 - 1 < 4) && ((uStack_80 == 3 || ((local_50 < 5 && (local_4c == local_48)))))) {
        if (gc == (GCobj *)0x0) {
          uVar15 = uVar18;
          if (!bVar4) {
            uVar15 = 0;
          }
          uVar9 = 0x1f;
          if (uVar17 - 1 != 0) {
            for (; uVar17 - 1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          hbits = (uVar9 ^ 0xffffffe0) + 0x21;
          if (uVar17 < 2) {
            hbits = uVar17;
          }
          gc = (GCobj *)lj_tab_new(fs->L,uVar15,hbits);
          BVar8 = const_gc(fs,gc,0xfffffff4);
          fs->bcbase[local_40].ins = BVar8 << 0x10 | (uint)local_38 | 0x33;
        }
        if (uStack_80 < 3) {
          local_60.field_2.it = ~uStack_80;
        }
        else {
          local_60 = local_88;
          if (uStack_80 == 3) {
            local_60.field_2.it = 0xfffffffb;
            local_60.u32.lo = local_88.u32.lo;
          }
        }
        pTVar12 = lj_tab_set(fs->L,&gc->tab,&local_60);
        if (((gc->gch).marked & 4) != 0) {
          uVar13 = (ulong)(fs->L->glref).ptr32;
          (gc->gch).marked = (gc->gch).marked & 0xfb;
          (gc->gch).gclist.gcptr32 = *(uint32_t *)(uVar13 + 0x3c);
          *(uint32_t *)(uVar13 + 0x3c) = (uint32_t)gc;
        }
        if ((4 < local_50) || (local_4c != local_48)) {
          (pTVar12->u32).lo = (uint32_t)gc;
          (pTVar12->field_2).it = 0xfffffff4;
          bVar2 = false;
          bVar5 = true;
          goto LAB_0011b3cc;
        }
        if (local_50 < 3) {
          (pTVar12->field_2).it = ~local_50;
        }
        else if (local_50 == 3) {
          (pTVar12->u32).lo = local_58.s.info;
          (pTVar12->field_2).it = 0xfffffffb;
        }
        else {
          TVar3.field_2.it = local_58.s.aux;
          TVar3.field_2.field_0 =
               (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)local_58.s.info;
          *pTVar12 = TVar3;
        }
        bVar2 = true;
      }
      else {
LAB_0011b3cc:
        if (local_50 != 0xd) {
          expr_toanyreg(fs,(ExpDesc *)&local_58.s);
          bVar2 = false;
        }
        if (uStack_80 < 5) {
          expr_index(fs,e,(ExpDesc *)&local_88.field_2);
        }
        bcemit_store(fs,e,(ExpDesc *)&local_58.s);
        bVar2 = !bVar2;
      }
      fs->freereg = local_6c;
      if ((ls->token != 0x2c) && (ls->token != 0x3b)) break;
      lj_lex_next(ls);
      iVar7 = ls->token;
    } while (iVar7 != 0x7d);
    lex_match(ls,0x7d,0x7b,local_70);
    if (!bVar2) {
      uVar9 = fs->pc - 1;
      local_68 = (TValue *)(fs->bcbase + uVar9);
      local_88.u32.lo = uVar18 - 1;
      local_88.field_2.it = 0x43300000;
      uStack_80 = 4;
      uStack_7c = 0xffffffff;
      uStack_78 = 0xffffffff;
      if (0x100 < uVar18) {
        fs->pc = uVar9;
        local_68 = local_68 + -1;
      }
      uVar9 = local_6c << 8;
      BVar8 = const_num(fs,(ExpDesc *)&local_88.field_2);
      (local_68->u32).lo = BVar8 << 0x10 | uVar9 | 0x3c;
      *(undefined1 *)((long)local_68 + -5) = 0;
    }
  }
  EVar10 = VNONRELOC;
  if (BVar6 == fs->pc - 1) {
    (e->u).s.info = BVar6;
    fs->freereg = fs->freereg - 1;
    EVar10 = VRELOCABLE;
  }
  e->k = EVar10;
  if (gc == (GCobj *)0x0) {
    if (bVar4) {
      uVar14 = 3;
      if (2 < uVar18) {
        uVar9 = 0x7ff;
        if (uVar18 < 0x7ff) {
          uVar9 = uVar18;
        }
        uVar14 = (ushort)uVar9;
      }
    }
    else {
      uVar14 = 0;
    }
    if (uVar17 != 0) {
      if (uVar17 == 1) {
        uVar17 = 0x800;
      }
      else {
        uVar18 = 0x1f;
        if (uVar17 - 1 != 0) {
          for (; uVar17 - 1 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar17 = (uVar18 ^ 0x1f) * -0x800 + 0x10000;
      }
    }
    *(ushort *)((long)&fs->bcbase[BVar6].ins + 2) = (ushort)uVar17 | uVar14;
  }
  else {
    if ((bVar4) && ((gc->pt).sizekgc < uVar18)) {
      uVar17 = (gc->pt).sizekn;
      uVar9 = 0x1f;
      if (uVar17 != 0) {
        for (; uVar17 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar15 = (uVar9 ^ 0xffffffe0) + 0x21;
      if (uVar17 == 0) {
        uVar15 = 0;
      }
      resizetab(fs->L,&gc->tab,uVar18,uVar15);
    }
    if (bVar5) {
      MVar1 = (gc->pt).sizekn;
      uVar18 = (gc->uv).dhash;
      lVar16 = 0;
      do {
        if (*(int *)((ulong)uVar18 + 4 + lVar16) == -0xc) {
          *(undefined4 *)((ulong)uVar18 + 4 + lVar16) = 0xffffffff;
        }
        lVar16 = lVar16 + 0x18;
      } while ((ulong)(MVar1 + 1 + (uint)(MVar1 == 0xffffffff)) * 0x18 != lVar16);
    }
    uVar13 = (ulong)(fs->L->glref).ptr32;
    if (*(uint *)(uVar13 + 0x24) <= *(uint *)(uVar13 + 0x20)) {
      lj_gc_step(fs->L);
    }
  }
  return;
}

Assistant:

static void expr_table(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  BCLine line = ls->linenumber;
  GCtab *t = NULL;
  int vcall = 0, needarr = 0, fixt = 0;
  uint32_t narr = 1;  /* First array index. */
  uint32_t nhash = 0;  /* Number of hash entries. */
  BCReg freg = fs->freereg;
  BCPos pc = bcemit_AD(fs, BC_TNEW, freg, 0);
  expr_init(e, VNONRELOC, freg);
  bcreg_reserve(fs, 1);
  freg++;
  lex_check(ls, '{');
  while (ls->token != '}') {
    ExpDesc key, val;
    vcall = 0;
    if (ls->token == '[') {
      expr_bracket(ls, &key);  /* Already calls expr_toval. */
      if (!expr_isk(&key)) expr_index(fs, e, &key);
      if (expr_isnumk(&key) && expr_numiszero(&key)) needarr = 1; else nhash++;
      lex_check(ls, '=');
    } else if ((ls->token == TK_name || (!LJ_52 && ls->token == TK_goto)) &&
	       lj_lex_lookahead(ls) == '=') {
      expr_str(ls, &key);
      lex_check(ls, '=');
      nhash++;
    } else {
      expr_init(&key, VKNUM, 0);
      setintV(&key.u.nval, (int)narr);
      narr++;
      needarr = vcall = 1;
    }
    expr(ls, &val);
    if (expr_isk(&key) && key.k != VKNIL &&
	(key.k == VKSTR || expr_isk_nojump(&val))) {
      TValue k, *v;
      if (!t) {  /* Create template table on demand. */
	BCReg kidx;
	t = lj_tab_new(fs->L, needarr ? narr : 0, hsize2hbits(nhash));
	kidx = const_gc(fs, obj2gco(t), LJ_TTAB);
	fs->bcbase[pc].ins = BCINS_AD(BC_TDUP, freg-1, kidx);
      }
      vcall = 0;
      expr_kvalue(&k, &key);
      v = lj_tab_set(fs->L, t, &k);
      lj_gc_anybarriert(fs->L, t);
      if (expr_isk_nojump(&val)) {  /* Add const key/value to template table. */
	expr_kvalue(v, &val);
      } else {  /* Otherwise create dummy string key (avoids lj_tab_newkey). */
	settabV(fs->L, v, t);  /* Preserve key with table itself as value. */
	fixt = 1;   /* Fix this later, after all resizes. */
	goto nonconst;
      }
    } else {
    nonconst:
      if (val.k != VCALL) { expr_toanyreg(fs, &val); vcall = 0; }
      if (expr_isk(&key)) expr_index(fs, e, &key);
      bcemit_store(fs, e, &val);
    }
    fs->freereg = freg;
    if (!lex_opt(ls, ',') && !lex_opt(ls, ';')) break;
  }
  lex_match(ls, '}', '{', line);
  if (vcall) {
    BCInsLine *ilp = &fs->bcbase[fs->pc-1];
    ExpDesc en;
    lua_assert(bc_a(ilp->ins) == freg &&
	       bc_op(ilp->ins) == (narr > 256 ? BC_TSETV : BC_TSETB));
    expr_init(&en, VKNUM, 0);
    en.u.nval.u32.lo = narr-1;
    en.u.nval.u32.hi = 0x43300000;  /* Biased integer to avoid denormals. */
    if (narr > 256) { fs->pc--; ilp--; }
    ilp->ins = BCINS_AD(BC_TSETM, freg, const_num(fs, &en));
    setbc_b(&ilp[-1].ins, 0);
  }
  if (pc == fs->pc-1) {  /* Make expr relocable if possible. */
    e->u.s.info = pc;
    fs->freereg--;
    e->k = VRELOCABLE;
  } else {
    e->k = VNONRELOC;  /* May have been changed by expr_index. */
  }
  if (!t) {  /* Construct TNEW RD: hhhhhaaaaaaaaaaa. */
    BCIns *ip = &fs->bcbase[pc].ins;
    if (!needarr) narr = 0;
    else if (narr < 3) narr = 3;
    else if (narr > 0x7ff) narr = 0x7ff;
    setbc_d(ip, narr|(hsize2hbits(nhash)<<11));
  } else {
    if (needarr && t->asize < narr)
      lj_tab_reasize(fs->L, t, narr-1);
    if (fixt) {  /* Fix value for dummy keys in template table. */
      Node *node = noderef(t->node);
      uint32_t i, hmask = t->hmask;
      for (i = 0; i <= hmask; i++) {
	Node *n = &node[i];
	if (tvistab(&n->val)) {
	  lua_assert(tabV(&n->val) == t);
	  setnilV(&n->val);  /* Turn value into nil. */
	}
      }
    }
    lj_gc_check(fs->L);
  }
}